

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

handle pybind11::detail::
       list_caster<std::vector<unsigned_short,std::allocator<unsigned_short>>,unsigned_short>::
       cast<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *src,
                 return_value_policy policy,handle parent)

{
  pointer puVar1;
  PyObject *pPVar2;
  handle hVar3;
  long lVar4;
  unsigned_short *value;
  pointer puVar5;
  PyObject *tmp;
  list l;
  object value_;
  handle local_40;
  handle local_38;
  
  list::list((list *)&local_40,
             (long)(src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 1);
  puVar5 = (src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    hVar3.m_ptr = (PyObject *)0x0;
    lVar4 = 0;
    do {
      pPVar2 = (PyObject *)PyLong_FromSize_t(*puVar5);
      local_38.m_ptr = pPVar2;
      if (pPVar2 != (PyObject *)0x0) {
        local_38.m_ptr = (PyObject *)0x0;
        (&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt)[lVar4] = (Py_ssize_t)pPVar2;
        lVar4 = lVar4 + 1;
      }
      object::~object((object *)&local_38);
      if (pPVar2 == (PyObject *)0x0) goto LAB_001c5e88;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  hVar3.m_ptr = local_40.m_ptr;
  local_40.m_ptr = (PyObject *)0x0;
LAB_001c5e88:
  object::~object((object *)&local_40);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }